

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type * __thiscall
FadBinaryDiv<FadCst<int>,_Fad<Fad<double>_>_>::val
          (value_type *__return_storage_ptr__,FadBinaryDiv<FadCst<int>,_Fad<Fad<double>_>_> *this)

{
  double dVar1;
  int iVar2;
  Fad<Fad<double>_> *pFVar3;
  double *pdVar4;
  long lVar5;
  int i;
  long lVar6;
  double dVar7;
  
  pFVar3 = this->right_;
  dVar7 = (double)(this->left_).constant_;
  __return_storage_ptr__->val_ = dVar7 / (pFVar3->val_).val_;
  iVar2 = (pFVar3->val_).dx_.num_elts;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  if (0 < (long)iVar2) {
    (__return_storage_ptr__->dx_).num_elts = iVar2;
    pdVar4 = (double *)operator_new__((long)iVar2 << 3);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar4;
  }
  __return_storage_ptr__->defaultVal = 0.0;
  lVar5 = (long)(pFVar3->val_).dx_.num_elts;
  if (0 < lVar5) {
    pdVar4 = (__return_storage_ptr__->dx_).ptr_to_data;
    lVar6 = 0;
    do {
      dVar1 = (pFVar3->val_).val_;
      pdVar4[lVar6] = (-(pFVar3->val_).dx_.ptr_to_data[lVar6] * dVar7) / (dVar1 * dVar1);
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

const value_type val() const {return left_.val() / right_.val();}